

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DCase::createInstance
          (TextureGather2DCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  Context *pCVar2;
  GatherArgs *__cur;
  VkPhysicalDeviceProperties *pVVar3;
  TextureGatherInstance *this_00;
  Context *pCVar4;
  IVec2 *pIVar5;
  pointer pGVar6;
  TextureFormat *ctx;
  IVec2 *pIVar7;
  undefined1 *puVar8;
  long lVar9;
  int i;
  long lVar10;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  iterations;
  TextureFormat local_48;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  local_40;
  
  ctx = &local_48;
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar3 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_48.order = (pVVar3->limits).minTexelGatherOffset;
    local_48.type = (pVVar3->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_48.order = ~RGB;
    local_48.type = UNORM_BYTE_44;
  }
  else if (OVar1 == OFFSETSIZE_NONE) {
    local_48.order = R;
    local_48.type = SNORM_INT8;
  }
  else {
    local_48.order = ~R;
    local_48.type = ~SNORM_INT8;
  }
  generateBasic2DCaseIterations
            (&local_40,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_48);
  this_00 = (TextureGatherInstance *)operator_new(0x2d8);
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGather2DInstance_00d26df0;
  *(undefined8 *)&this_00->field_0x264 = *(undefined8 *)(this->m_textureSize).m_data;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
  this_00[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)0x0;
  pCVar4 = (Context *)
           std::
           _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
           ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          *)(((long)local_40.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_40.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                            -0x71c71c71c71c71c7),(size_t)context);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = pCVar4;
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = pCVar4;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)
                (((long)local_40.
                        super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_40.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                       ._M_impl.super__Vector_impl_data._M_start) + (long)pCVar4);
  if (local_40.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar5 = (local_40.
              super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
              ._M_impl.super__Vector_impl_data._M_start)->offsets;
    pGVar6 = local_40.
             super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = pCVar4;
    do {
      puVar8 = (undefined1 *)((long)&pCVar2->m_testCtx + 4);
      *(int *)&pCVar4->m_testCtx = pGVar6->componentNdx;
      lVar9 = 0;
      pIVar7 = pIVar5;
      do {
        lVar10 = 0;
        do {
          *(int *)(puVar8 + lVar10 * 4) = pIVar7->m_data[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 == 1);
        lVar9 = lVar9 + 1;
        puVar8 = puVar8 + 8;
        pIVar7 = pIVar7 + 1;
      } while (lVar9 != 4);
      pGVar6 = pGVar6 + 1;
      pCVar4 = (Context *)
               &(pCVar4->m_device).
                super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data
                .field_0xc;
      pCVar2 = (Context *)
               &(pCVar2->m_device).
                super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data
                .field_0xc;
      pIVar5 = (IVec2 *)((long)(pIVar5 + 4) + 4);
    } while (pGVar6 != local_40.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = pCVar4;
  local_48.order = CHANNELORDER_LAST;
  local_48.type = CHANNELTYPE_LAST;
  tcu::Texture2D::Texture2D
            ((Texture2D *)
             &this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
              .m_data.field_0x8,&local_48,1,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)ctx);
  if (local_40.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGather2DCase::createInstance (Context& context) const
{
	const vector<GatherArgs>	iterations	= generateBasic2DCaseIterations(m_baseParams.gatherType,
																			m_baseParams.textureFormat,
																			getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits));

	return new TextureGather2DInstance(context, m_baseParams, m_textureSize, iterations);
}